

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_pack.cpp
# Opt level: O3

ScalarFunction * duckdb::GetStructPackFunction<true>(void)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  ScalarFunction *in_RDI;
  FunctionNullHandling null_handling;
  code *bind_lambda;
  vector<duckdb::LogicalType,_true> local_a8;
  LogicalType local_90;
  string local_78;
  LogicalType local_58;
  LogicalType local_40;
  
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"struct_pack","");
  local_a8.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  LogicalType::LogicalType(&local_90,STRUCT);
  bind_lambda = StructPackFunction;
  null_handling = 0x9e;
  LogicalType::LogicalType(&local_58,INVALID);
  ScalarFunction::ScalarFunction
            (in_RDI,&local_78,&local_a8,&local_90,(scalar_function_t *)&stack0xffffffffffffff38,
             StructPackBind<true>,(bind_scalar_function_extended_t)0x0,StructPackStats,
             (init_local_state_t)0x0,(LogicalType)ZEXT824(&local_58),CONSISTENT,null_handling,
             bind_lambda);
  LogicalType::~LogicalType(&local_58);
  ::std::
  _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
  ::_M_manager((_Any_data *)&stack0xffffffffffffff38,(_Any_data *)&stack0xffffffffffffff38,
               __destroy_functor);
  LogicalType::~LogicalType(&local_90);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  LogicalType::LogicalType(&local_40,ANY);
  (in_RDI->super_BaseScalarFunction).super_SimpleFunction.varargs.id_ = local_40.id_;
  (in_RDI->super_BaseScalarFunction).super_SimpleFunction.varargs.physical_type_ =
       local_40.physical_type_;
  peVar1 = (in_RDI->super_BaseScalarFunction).super_SimpleFunction.varargs.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (in_RDI->super_BaseScalarFunction).super_SimpleFunction.varargs.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (in_RDI->super_BaseScalarFunction).super_SimpleFunction.varargs.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_40.type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (in_RDI->super_BaseScalarFunction).super_SimpleFunction.varargs.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_40.type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_40.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = peVar1;
  local_40.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var2;
  LogicalType::~LogicalType(&local_40);
  (in_RDI->super_BaseScalarFunction).null_handling = SPECIAL_HANDLING;
  in_RDI->serialize = VariableReturnBindData::Serialize;
  in_RDI->deserialize = VariableReturnBindData::Deserialize;
  return in_RDI;
}

Assistant:

ScalarFunction GetStructPackFunction() {
	ScalarFunction fun(IS_STRUCT_PACK ? "struct_pack" : "row", {}, LogicalTypeId::STRUCT, StructPackFunction,
	                   StructPackBind<IS_STRUCT_PACK>, nullptr, StructPackStats);
	fun.varargs = LogicalType::ANY;
	fun.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	fun.serialize = VariableReturnBindData::Serialize;
	fun.deserialize = VariableReturnBindData::Deserialize;
	return fun;
}